

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O3

void TPZShapeHDiv<pzshape::TPZShapeTetra>::HDivPermutation
               (int side,TPZShapeData *data,TPZVec<int> *permutegather)

{
  int iVar1;
  uint uVar2;
  MElementType eltype;
  long *plVar3;
  ulong uVar4;
  TPZManVector<long,_4> id;
  TPZManVector<long,_4> local_68;
  
  iVar1 = pztopology::TPZTetrahedron::SideDimension(side);
  if (iVar1 != 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"HDivPermutation called with wrong side parameter ",0x31);
    plVar3 = (long *)std::ostream::operator<<(&std::cout,side);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
               ,0x15c);
  }
  uVar2 = pztopology::TPZTetrahedron::NSideNodes(side);
  TPZManVector<long,_4>::TPZManVector(&local_68,(long)(int)uVar2);
  if (0 < (int)uVar2) {
    uVar4 = 0;
    do {
      iVar1 = pztopology::TPZTetrahedron::SideNodeLocId(side,(int)uVar4);
      local_68.super_TPZVec<long>.fStore[uVar4] =
           (data->fCornerNodeIds).super_TPZVec<long>.fStore[iVar1];
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  eltype = pztopology::TPZTetrahedron::Type(side);
  HDivPermutation(eltype,&local_68.super_TPZVec<long>,permutegather);
  if (local_68.super_TPZVec<long>.fStore != local_68.fExtAlloc) {
    local_68.super_TPZVec<long>.fNAlloc = 0;
    local_68.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
    if (local_68.super_TPZVec<long>.fStore != (long *)0x0) {
      operator_delete__(local_68.super_TPZVec<long>.fStore);
    }
  }
  return;
}

Assistant:

void TPZShapeHDiv<TSHAPE>::HDivPermutation(int side, TPZShapeData &data, TPZVec<int> &permutegather) {
    int dimension = TSHAPE::Dimension;
    int sidedimension = TSHAPE::SideDimension(side);

    if(dimension != sidedimension+1)
    {
        std::cout << "HDivPermutation called with wrong side parameter " << side << std::endl;
        DebugStop();
    }
    

    const int nsidenodes = TSHAPE::NSideNodes(side);
    TPZManVector<int64_t,4> id(nsidenodes);
    for(int inode=0; inode<nsidenodes; inode++)
    {

        int64_t nodeindex = TSHAPE::SideNodeLocId(side, inode);
//        id[inode] = NodePtr(nodeindex)->Id();
        id[inode] = data.fCornerNodeIds[nodeindex];
    }
    
    MElementType sidetype = TSHAPE::Type(side);
    HDivPermutation(sidetype, id, permutegather);

}